

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_dest.c
# Opt level: O2

int mpt_string_dest(mpt_strdest *addr,int sep,char *descr)

{
  char cVar1;
  int *piVar2;
  ushort **ppuVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  char *__nptr;
  int iVar7;
  long lVar8;
  char *end;
  
  uVar5 = (ulong)addr->change;
  if (uVar5 == 0) {
    uVar5 = 7;
  }
  else if (7 < addr->change) {
    piVar2 = __errno_location();
    *piVar2 = 0x22;
    return -1;
  }
  addr->change = '\0';
  if (descr == (char *)0x0) {
    iVar7 = 0;
  }
  else {
    ppuVar3 = __ctype_b_loc();
    lVar8 = 0;
    while ((*(byte *)((long)*ppuVar3 + (long)descr[lVar8] * 2 + 1) & 0x20) != 0) {
      lVar8 = lVar8 + 1;
    }
    __nptr = descr + lVar8;
    for (uVar6 = 0; iVar7 = (int)lVar8, uVar5 != uVar6; uVar6 = uVar6 + 1) {
      uVar4 = strtol(__nptr,&end,0);
      if ((long)end - (long)__nptr == 0) {
        if (*end == '\0') {
          return iVar7;
        }
        if (*end != sep) {
          piVar2 = __errno_location();
          *piVar2 = 0x16;
          return -iVar7;
        }
        lVar8 = lVar8 + 1;
        if ((*(byte *)((long)*ppuVar3 + (long)end[1] * 2 + 1) & 0x20) != 0) {
          return (int)lVar8;
        }
      }
      else {
        lVar8 = ((long)end - (long)__nptr) + lVar8;
        iVar7 = (int)lVar8;
        if (0xff < uVar4) {
          piVar2 = __errno_location();
          *piVar2 = 0x22;
          return -iVar7;
        }
        addr->val[uVar6] = (uint8_t)uVar4;
        addr->change = addr->change | (byte)(1 << ((byte)uVar6 & 0x1f));
        cVar1 = *end;
        if ((long)cVar1 == 0) {
          return iVar7;
        }
        if (cVar1 != sep) {
          return iVar7;
        }
        if (((*ppuVar3)[cVar1] & 0x2000) != 0) {
          return iVar7;
        }
        lVar8 = lVar8 + 1;
        __nptr = end;
      }
      __nptr = __nptr + 1;
    }
  }
  return iVar7;
}

Assistant:

extern int mpt_string_dest(MPT_STRUCT(strdest) *addr, int sep, const char *descr)
{
	char *end;
	size_t pos = 0, max, i;
	long val;
	
	if (!(max = addr->change)) {
		max = sizeof(addr->val);
	}
	else if (max > sizeof(addr->val)) {
		errno = ERANGE; return -1;
	}
	addr->change = 0;
	
	if (!descr)
		return 0;
	
	while (isspace(*descr)) {
		pos++; descr++;
	}
	
	for (i = 0 ; i < max ; i++) {
		val = strtol(descr, &end, 0);
		if (end == descr) {
			if (!*end)
				break;
			
			if (sep && *end == sep) {
				descr++; pos++;
				if (isspace(end[1]))
					break;
				continue;
			}
			errno = EINVAL; return -pos;
		}
		pos += (end - descr);
		
		if (val < 0 || val > UINT8_MAX) {
			errno = ERANGE; return -pos;
		}
		addr->val[i] = val;
		addr->change |= 1 << i;
		
		if (!*(descr = end) || isspace(*descr) || sep != *descr)
			break;
		
		descr++; pos++;
	}
	return pos;
}